

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cfg.cpp
# Opt level: O2

void __thiscall spirv_cross::DominatorBuilder::add_block(DominatorBuilder *this,uint32_t block)

{
  uint32_t uVar1;
  
  uVar1 = CFG::get_immediate_dominator(this->cfg,block);
  if (uVar1 != 0) {
    uVar1 = this->dominator;
    if (uVar1 != 0) {
      if (uVar1 == block) {
        return;
      }
      block = CFG::find_common_dominator(this->cfg,block,uVar1);
    }
    this->dominator = block;
  }
  return;
}

Assistant:

void DominatorBuilder::add_block(uint32_t block)
{
	if (!cfg.get_immediate_dominator(block))
	{
		// Unreachable block via the CFG, we will never emit this code anyways.
		return;
	}

	if (!dominator)
	{
		dominator = block;
		return;
	}

	if (block != dominator)
		dominator = cfg.find_common_dominator(block, dominator);
}